

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

UBool __thiscall
icu_63::UnicodeString::padTrailing(UnicodeString *this,int32_t targetLength,UChar padChar)

{
  short sVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  UBool UVar11;
  char16_t *pcVar12;
  UChar *pUVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int32_t iVar17;
  UBool UVar18;
  int iVar20;
  undefined1 auVar19 [16];
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  int iVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar38;
  int iVar40;
  undefined1 auVar39 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar43 [16];
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar17 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar17 = (int)sVar1 >> 5;
  }
  UVar18 = '\0';
  if (iVar17 < targetLength) {
    UVar11 = cloneArrayIfNeeded(this,targetLength,-1,'\x01',(int32_t **)0x0,'\0');
    auVar10 = _DAT_002fd830;
    auVar9 = _DAT_002fd820;
    auVar8 = _DAT_002f48a0;
    auVar7 = _DAT_002f4890;
    auVar6 = _DAT_002f4880;
    UVar18 = '\0';
    if (UVar11 != '\0') {
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar12 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar12 = (char16_t *)((long)&this->fUnion + 2);
      }
      lVar14 = (long)targetLength;
      lVar16 = (lVar14 - iVar17) + -1;
      auVar19._8_4_ = (int)lVar16;
      auVar19._0_8_ = lVar16;
      auVar19._12_4_ = (int)((ulong)lVar16 >> 0x20);
      pUVar13 = pcVar12 + lVar14 + -1;
      uVar15 = 0;
      auVar19 = auVar19 ^ _DAT_002f48a0;
      do {
        auVar31._8_4_ = (int)uVar15;
        auVar31._0_8_ = uVar15;
        auVar31._12_4_ = (int)(uVar15 >> 0x20);
        auVar23 = (auVar31 | auVar7) ^ auVar8;
        iVar32 = auVar19._0_4_;
        iVar38 = -(uint)(iVar32 < auVar23._0_4_);
        iVar20 = auVar19._4_4_;
        auVar24._4_4_ = -(uint)(iVar20 < auVar23._4_4_);
        iVar37 = auVar19._8_4_;
        iVar40 = -(uint)(iVar37 < auVar23._8_4_);
        iVar21 = auVar19._12_4_;
        auVar24._12_4_ = -(uint)(iVar21 < auVar23._12_4_);
        auVar34._4_4_ = iVar38;
        auVar34._0_4_ = iVar38;
        auVar34._8_4_ = iVar40;
        auVar34._12_4_ = iVar40;
        auVar41 = pshuflw(in_XMM11,auVar34,0xe8);
        auVar26._4_4_ = -(uint)(auVar23._4_4_ == iVar20);
        auVar26._12_4_ = -(uint)(auVar23._12_4_ == iVar21);
        auVar26._0_4_ = auVar26._4_4_;
        auVar26._8_4_ = auVar26._12_4_;
        auVar43 = pshuflw(in_XMM12,auVar26,0xe8);
        auVar24._0_4_ = auVar24._4_4_;
        auVar24._8_4_ = auVar24._12_4_;
        auVar42 = pshuflw(auVar41,auVar24,0xe8);
        auVar23._8_4_ = 0xffffffff;
        auVar23._0_8_ = 0xffffffffffffffff;
        auVar23._12_4_ = 0xffffffff;
        auVar23 = (auVar42 | auVar43 & auVar41) ^ auVar23;
        auVar23 = packssdw(auVar23,auVar23);
        if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *pUVar13 = padChar;
        }
        auVar24 = auVar26 & auVar34 | auVar24;
        auVar23 = packssdw(auVar24,auVar24);
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar23 = packssdw(auVar23 ^ auVar42,auVar23 ^ auVar42);
        if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
          pUVar13[-1] = padChar;
        }
        auVar23 = (auVar31 | auVar6) ^ auVar8;
        iVar38 = -(uint)(iVar32 < auVar23._0_4_);
        auVar39._4_4_ = -(uint)(iVar20 < auVar23._4_4_);
        iVar40 = -(uint)(iVar37 < auVar23._8_4_);
        auVar39._12_4_ = -(uint)(iVar21 < auVar23._12_4_);
        auVar25._4_4_ = iVar38;
        auVar25._0_4_ = iVar38;
        auVar25._8_4_ = iVar40;
        auVar25._12_4_ = iVar40;
        auVar33._4_4_ = -(uint)(auVar23._4_4_ == iVar20);
        auVar33._12_4_ = -(uint)(auVar23._12_4_ == iVar21);
        auVar33._0_4_ = auVar33._4_4_;
        auVar33._8_4_ = auVar33._12_4_;
        auVar39._0_4_ = auVar39._4_4_;
        auVar39._8_4_ = auVar39._12_4_;
        auVar23 = auVar33 & auVar25 | auVar39;
        auVar23 = packssdw(auVar23,auVar23);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar23 = packssdw(auVar23 ^ auVar3,auVar23 ^ auVar3);
        if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pUVar13[-2] = padChar;
        }
        auVar26 = pshufhw(auVar25,auVar25,0x84);
        auVar34 = pshufhw(auVar33,auVar33,0x84);
        auVar24 = pshufhw(auVar26,auVar39,0x84);
        auVar27._8_4_ = 0xffffffff;
        auVar27._0_8_ = 0xffffffffffffffff;
        auVar27._12_4_ = 0xffffffff;
        auVar27 = (auVar24 | auVar34 & auVar26) ^ auVar27;
        auVar26 = packssdw(auVar27,auVar27);
        if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pUVar13[-3] = padChar;
        }
        auVar26 = (auVar31 | auVar10) ^ auVar8;
        iVar38 = -(uint)(iVar32 < auVar26._0_4_);
        auVar29._4_4_ = -(uint)(iVar20 < auVar26._4_4_);
        iVar40 = -(uint)(iVar37 < auVar26._8_4_);
        auVar29._12_4_ = -(uint)(iVar21 < auVar26._12_4_);
        auVar35._4_4_ = iVar38;
        auVar35._0_4_ = iVar38;
        auVar35._8_4_ = iVar40;
        auVar35._12_4_ = iVar40;
        auVar23 = pshuflw(auVar23,auVar35,0xe8);
        auVar28._4_4_ = -(uint)(auVar26._4_4_ == iVar20);
        auVar28._12_4_ = -(uint)(auVar26._12_4_ == iVar21);
        auVar28._0_4_ = auVar28._4_4_;
        auVar28._8_4_ = auVar28._12_4_;
        in_XMM12 = pshuflw(auVar43 & auVar41,auVar28,0xe8);
        in_XMM12 = in_XMM12 & auVar23;
        auVar29._0_4_ = auVar29._4_4_;
        auVar29._8_4_ = auVar29._12_4_;
        auVar23 = pshuflw(auVar23,auVar29,0xe8);
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar41 = (auVar23 | in_XMM12) ^ auVar41;
        in_XMM11 = packssdw(auVar41,auVar41);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pUVar13[-4] = padChar;
        }
        auVar29 = auVar28 & auVar35 | auVar29;
        auVar23 = packssdw(auVar29,auVar29);
        auVar43._8_4_ = 0xffffffff;
        auVar43._0_8_ = 0xffffffffffffffff;
        auVar43._12_4_ = 0xffffffff;
        auVar23 = packssdw(auVar23 ^ auVar43,auVar23 ^ auVar43);
        if ((auVar23 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pUVar13[-5] = padChar;
        }
        auVar23 = (auVar31 | auVar9) ^ auVar8;
        iVar32 = -(uint)(iVar32 < auVar23._0_4_);
        auVar36._4_4_ = -(uint)(iVar20 < auVar23._4_4_);
        iVar37 = -(uint)(iVar37 < auVar23._8_4_);
        auVar36._12_4_ = -(uint)(iVar21 < auVar23._12_4_);
        auVar30._4_4_ = iVar32;
        auVar30._0_4_ = iVar32;
        auVar30._8_4_ = iVar37;
        auVar30._12_4_ = iVar37;
        auVar22._4_4_ = -(uint)(auVar23._4_4_ == iVar20);
        auVar22._12_4_ = -(uint)(auVar23._12_4_ == iVar21);
        auVar22._0_4_ = auVar22._4_4_;
        auVar22._8_4_ = auVar22._12_4_;
        auVar36._0_4_ = auVar36._4_4_;
        auVar36._8_4_ = auVar36._12_4_;
        auVar23 = auVar22 & auVar30 | auVar36;
        auVar23 = packssdw(auVar23,auVar23);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar23 = packssdw(auVar23 ^ auVar4,auVar23 ^ auVar4);
        if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pUVar13[-6] = padChar;
        }
        auVar31 = pshufhw(auVar30,auVar30,0x84);
        auVar23 = pshufhw(auVar22,auVar22,0x84);
        auVar26 = pshufhw(auVar31,auVar36,0x84);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar23 = packssdw(auVar23 & auVar31,(auVar26 | auVar23 & auVar31) ^ auVar5);
        if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pUVar13[-7] = padChar;
        }
        uVar15 = uVar15 + 8;
        pUVar13 = pUVar13 + -8;
      } while (((lVar14 - iVar17) + 7U & 0xfffffffffffffff8) != uVar15);
      uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (targetLength < 0x400) {
        (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(targetLength << 5) | uVar2 & 0x1f;
      }
      else {
        (this->fUnion).fStackFields.fLengthAndFlags = uVar2 | 0xffe0;
        (this->fUnion).fFields.fLength = targetLength;
      }
      UVar18 = '\x01';
    }
  }
  return UVar18;
}

Assistant:

UBool 
UnicodeString::padTrailing(int32_t targetLength,
                           UChar padChar)
{
  int32_t oldLength = length();
  if(oldLength >= targetLength || !cloneArrayIfNeeded(targetLength)) {
    return FALSE;
  } else {
    // fill in padding character
    UChar *array = getArrayStart();
    int32_t length = targetLength;
    while(--length >= oldLength) {
      array[length] = padChar;
    }
    setLength(targetLength);
    return TRUE;
  }
}